

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O1

string * generateStringVector<std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__3>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    *__return_storage_ptr__,undefined8 *data)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uint *puVar9;
  undefined8 uVar10;
  uint uVar11;
  string __str_1;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_t local_58;
  uint *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  puVar9 = (uint *)*data;
  local_38 = (uint *)data[1];
  if (puVar9 != local_38) {
    do {
      uVar1 = *puVar9;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      uVar11 = 1;
      if (9 < uVar3) {
        uVar7 = (ulong)uVar3;
        uVar4 = 4;
        do {
          uVar11 = uVar4;
          uVar5 = (uint)uVar7;
          if (uVar5 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00318ef7;
          }
          if (uVar5 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00318ef7;
          }
          if (uVar5 < 10000) goto LAB_00318ef7;
          uVar7 = uVar7 / 10000;
          uVar4 = uVar11 + 4;
        } while (99999 < uVar5);
        uVar11 = uVar11 + 1;
      }
LAB_00318ef7:
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_78,(ulong)(uVar11 + -((int)uVar1 >> 0x1f)),'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_78._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),uVar11,uVar3);
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_78,"::");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar6->_M_dataplus)._M_p;
      paVar8 = &pbVar6->field_2;
      if (paVar2 == paVar8) {
        local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_b8._M_dataplus._M_p = (pointer)paVar2;
      }
      local_b8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      uVar1 = puVar9[1];
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      uVar11 = 1;
      if (9 < uVar3) {
        uVar7 = (ulong)uVar3;
        uVar4 = 4;
        do {
          uVar11 = uVar4;
          uVar5 = (uint)uVar7;
          if (uVar5 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00318fec;
          }
          if (uVar5 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00318fec;
          }
          if (uVar5 < 10000) goto LAB_00318fec;
          uVar7 = uVar7 / 10000;
          uVar4 = uVar11 + 4;
        } while (99999 < uVar5);
        uVar11 = uVar11 + 1;
      }
LAB_00318fec:
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_d8,(ulong)(uVar11 + -((int)uVar1 >> 0x1f)),'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_d8._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),uVar11,uVar3);
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        uVar10 = local_b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_d8._M_string_length + local_b8._M_string_length) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar10 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_d8._M_string_length + local_b8._M_string_length)
        goto LAB_00319070;
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           (&local_d8,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      }
      else {
LAB_00319070:
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_b8,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      }
      local_98._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar2 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar2) {
        local_98.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
      }
      local_98._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar2;
      pbVar6->_M_string_length = 0;
      paVar2->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_b8,&local_98);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_58,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_b8,-1,' ',true,hex);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_b8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,',');
      puVar9 = puVar9 + 2;
    } while (puVar9 != local_38);
  }
  if (__return_storage_ptr__->_M_string_length < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,']');
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] = ']';
  }
  return (string *)__return_storage_ptr__;
}

Assistant:

std::string generateStringVector(const X& data, Proc generator)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        ret.append(helics::generateJsonQuotedString(generator(ele)));
        ret.push_back(',');
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}